

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimulationIslandManager.cpp
# Opt level: O3

void __thiscall
cbtSimulationIslandManager::buildAndProcessIslands
          (cbtSimulationIslandManager *this,cbtDispatcher *dispatcher,
          cbtCollisionWorld *collisionWorld,IslandCallback *callback)

{
  cbtElement *pcVar1;
  cbtCollisionObject *pcVar2;
  cbtCollisionObject **ptr;
  cbtPersistentManifold **ppcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  cbtCollisionObject **ppcVar7;
  cbtPersistentManifold **ppcVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  CProfileSample __profile;
  CProfileSample local_6d;
  int local_6c;
  cbtPersistentManifoldSortPredicate local_66;
  cbtPersistentManifoldSortPredicateDeterministic local_65;
  uint local_64;
  ulong local_60;
  ulong local_58;
  cbtCollisionWorld *local_50;
  IslandCallback *local_48;
  ulong local_40;
  long local_38;
  
  local_48 = callback;
  buildIslands(this,dispatcher,collisionWorld);
  uVar6 = (this->m_unionFind).m_elements.m_size;
  uVar9 = (ulong)uVar6;
  CProfileSample::CProfileSample(&local_6d,"processIslands");
  local_50 = collisionWorld;
  if (this->m_splitIslands == false) {
    iVar13 = (*dispatcher->_vptr_cbtDispatcher[0xb])(dispatcher);
    iVar5 = (*dispatcher->_vptr_cbtDispatcher[9])(dispatcher);
    (**(code **)(*(long *)local_48 + 0x10))
              (local_48,(local_50->m_collisionObjects).m_data,(local_50->m_collisionObjects).m_size,
               iVar13,iVar5,0xffffffff);
  }
  else {
    iVar13 = (this->m_islandmanifold).m_size;
    if ((collisionWorld->m_dispatchInfo).m_deterministicOverlappingPairs == true) {
      if (1 < iVar13) {
        cbtAlignedObjectArray<cbtPersistentManifold_*>::
        quickSortInternal<cbtPersistentManifoldSortPredicateDeterministic>
                  (&this->m_islandmanifold,&local_65,0,iVar13 + -1);
      }
    }
    else if (1 < iVar13) {
      cbtAlignedObjectArray<cbtPersistentManifold_*>::
      quickSortInternal<cbtPersistentManifoldSortPredicate>
                (&this->m_islandmanifold,&local_66,0,iVar13 + -1);
    }
    if (0 < (int)uVar6) {
      uVar14 = 0;
      local_64 = 1;
      local_58 = 0;
      local_40 = uVar9;
      local_38 = (long)iVar13;
      do {
        uVar11 = (ulong)(int)uVar14;
        local_6c = (this->m_unionFind).m_elements.m_data[uVar11].m_id;
        uVar6 = (int)uVar14 + 1;
        local_60 = (ulong)uVar6;
        if ((int)uVar6 < (int)uVar9) {
          local_60 = uVar9 & 0xffffffff;
        }
        bVar4 = true;
        do {
          pcVar1 = (this->m_unionFind).m_elements.m_data;
          uVar14 = uVar11;
          if (pcVar1[uVar11].m_id != local_6c) break;
          pcVar2 = (collisionWorld->m_collisionObjects).m_data[pcVar1[uVar11].m_sz];
          uVar6 = (this->m_islandBodies).m_size;
          if (uVar6 == (this->m_islandBodies).m_capacity) {
            iVar13 = uVar6 * 2;
            if (uVar6 == 0) {
              iVar13 = 1;
            }
            uVar9 = local_40;
            if ((int)uVar6 < iVar13) {
              if (iVar13 == 0) {
                ppcVar7 = (cbtCollisionObject **)0x0;
              }
              else {
                ppcVar7 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar13 << 3,0x10);
                uVar6 = (this->m_islandBodies).m_size;
              }
              if (0 < (int)uVar6) {
                uVar9 = 0;
                do {
                  ppcVar7[uVar9] = (this->m_islandBodies).m_data[uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar6 != uVar9);
              }
              ptr = (this->m_islandBodies).m_data;
              if ((ptr != (cbtCollisionObject **)0x0) &&
                 ((this->m_islandBodies).m_ownsMemory == true)) {
                cbtAlignedFreeInternal(ptr);
                uVar6 = (this->m_islandBodies).m_size;
              }
              (this->m_islandBodies).m_ownsMemory = true;
              (this->m_islandBodies).m_data = ppcVar7;
              (this->m_islandBodies).m_capacity = iVar13;
              uVar9 = local_40;
              collisionWorld = local_50;
            }
          }
          (this->m_islandBodies).m_data[(int)uVar6] = pcVar2;
          (this->m_islandBodies).m_size = uVar6 + 1;
          iVar13 = pcVar2->m_activationState1;
          uVar11 = uVar11 + 1;
          bVar4 = (bool)((iVar13 == 5 || iVar13 == 2) & bVar4);
          uVar14 = local_60;
        } while ((long)uVar11 < (long)uVar9);
        local_60 = uVar14;
        iVar13 = (int)local_58;
        uVar6 = (uint)local_38;
        if (iVar13 < (int)uVar6) {
          ppcVar3 = (this->m_islandmanifold).m_data;
          lVar10 = (long)iVar13;
          iVar5 = ppcVar3[lVar10]->m_body0->m_islandTag1;
          if (iVar5 < 0) {
            iVar5 = ppcVar3[lVar10]->m_body1->m_islandTag1;
          }
          if (iVar5 != local_6c) goto LAB_008b7a12;
          ppcVar8 = ppcVar3 + lVar10;
          uVar14 = local_58 & 0xffffffff;
          uVar12 = iVar13 + 1U;
          if ((int)(iVar13 + 1U) < (int)uVar6) {
            uVar12 = uVar6;
          }
          do {
            lVar10 = lVar10 + 1;
            local_64 = uVar12;
            if (local_38 <= lVar10) break;
            iVar5 = ppcVar3[lVar10]->m_body0->m_islandTag1;
            if (iVar5 < 0) {
              iVar5 = ppcVar3[lVar10]->m_body1->m_islandTag1;
            }
            local_64 = (int)uVar14 + 1;
            uVar14 = (ulong)local_64;
          } while (local_6c == iVar5);
          iVar13 = local_64 - iVar13;
        }
        else {
LAB_008b7a12:
          iVar13 = 0;
          ppcVar8 = (cbtPersistentManifold **)0x0;
        }
        iVar5 = (this->m_islandBodies).m_size;
        if (!bVar4) {
          (**(code **)(*(long *)local_48 + 0x10))
                    (local_48,(this->m_islandBodies).m_data,iVar5,ppcVar8,iVar13,local_6c);
          iVar5 = (this->m_islandBodies).m_size;
        }
        uVar14 = local_60;
        local_58 = local_58 & 0xffffffff;
        if (iVar13 != 0) {
          local_58 = (ulong)local_64;
        }
        if (iVar5 < 0) {
          if ((this->m_islandBodies).m_capacity < 0) {
            ppcVar7 = (this->m_islandBodies).m_data;
            if ((ppcVar7 != (cbtCollisionObject **)0x0) &&
               ((this->m_islandBodies).m_ownsMemory == true)) {
              cbtAlignedFreeInternal(ppcVar7);
            }
            (this->m_islandBodies).m_ownsMemory = true;
            (this->m_islandBodies).m_data = (cbtCollisionObject **)0x0;
            (this->m_islandBodies).m_capacity = 0;
          }
          lVar10 = (long)iVar5;
          do {
            (this->m_islandBodies).m_data[lVar10] = (cbtCollisionObject *)0x0;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0);
        }
        (this->m_islandBodies).m_size = 0;
        collisionWorld = local_50;
      } while ((int)uVar14 < (int)uVar9);
    }
  }
  CProfileSample::~CProfileSample(&local_6d);
  return;
}

Assistant:

void cbtSimulationIslandManager::buildAndProcessIslands(cbtDispatcher* dispatcher, cbtCollisionWorld* collisionWorld, IslandCallback* callback)
{
	cbtCollisionObjectArray& collisionObjects = collisionWorld->getCollisionObjectArray();

	buildIslands(dispatcher, collisionWorld);

	int endIslandIndex = 1;
	int startIslandIndex;
	int numElem = getUnionFind().getNumElements();

	BT_PROFILE("processIslands");

	if (!m_splitIslands)
	{
		cbtPersistentManifold** manifold = dispatcher->getInternalManifoldPointer();
		int maxNumManifolds = dispatcher->getNumManifolds();
		callback->processIsland(&collisionObjects[0], collisionObjects.size(), manifold, maxNumManifolds, -1);
	}
	else
	{
		// Sort manifolds, based on islands
		// Sort the vector using predicate and std::sort
		//std::sort(islandmanifold.begin(), islandmanifold.end(), cbtPersistentManifoldSortPredicate);

		int numManifolds = int(m_islandmanifold.size());

		//tried a radix sort, but quicksort/heapsort seems still faster
		//@todo rewrite island management
		//cbtPersistentManifoldSortPredicateDeterministic sorts contact manifolds based on islandid,
		//but also based on object0 unique id and object1 unique id
		if (collisionWorld->getDispatchInfo().m_deterministicOverlappingPairs)
		{
			m_islandmanifold.quickSort(cbtPersistentManifoldSortPredicateDeterministic());
		}
		else
		{
			m_islandmanifold.quickSort(cbtPersistentManifoldSortPredicate());
		}

		//m_islandmanifold.heapSort(cbtPersistentManifoldSortPredicate());

		//now process all active islands (sets of manifolds for now)

		int startManifoldIndex = 0;
		int endManifoldIndex = 1;

		//int islandId;

		//	printf("Start Islands\n");

		//traverse the simulation islands, and call the solver, unless all objects are sleeping/deactivated
		for (startIslandIndex = 0; startIslandIndex < numElem; startIslandIndex = endIslandIndex)
		{
			int islandId = getUnionFind().getElement(startIslandIndex).m_id;

			bool islandSleeping = true;

			for (endIslandIndex = startIslandIndex; (endIslandIndex < numElem) && (getUnionFind().getElement(endIslandIndex).m_id == islandId); endIslandIndex++)
			{
				int i = getUnionFind().getElement(endIslandIndex).m_sz;
				cbtCollisionObject* colObj0 = collisionObjects[i];
				m_islandBodies.push_back(colObj0);
				if (colObj0->isActive())
					islandSleeping = false;
			}

			//find the accompanying contact manifold for this islandId
			int numIslandManifolds = 0;
			cbtPersistentManifold** startManifold = 0;

			if (startManifoldIndex < numManifolds)
			{
				int curIslandId = getIslandId(m_islandmanifold[startManifoldIndex]);
				if (curIslandId == islandId)
				{
					startManifold = &m_islandmanifold[startManifoldIndex];

					for (endManifoldIndex = startManifoldIndex + 1; (endManifoldIndex < numManifolds) && (islandId == getIslandId(m_islandmanifold[endManifoldIndex])); endManifoldIndex++)
					{
					}
					/// Process the actual simulation, only if not sleeping/deactivated
					numIslandManifolds = endManifoldIndex - startManifoldIndex;
				}
			}

			if (!islandSleeping)
			{
				callback->processIsland(&m_islandBodies[0], m_islandBodies.size(), startManifold, numIslandManifolds, islandId);
				//			printf("Island callback of size:%d bodies, %d manifolds\n",islandBodies.size(),numIslandManifolds);
			}

			if (numIslandManifolds)
			{
				startManifoldIndex = endManifoldIndex;
			}

			m_islandBodies.resize(0);
		}
	}  // else if(!splitIslands)
}